

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

bool __thiscall QPDF::parse_xrefFirst(QPDF *this,string *line,int *obj,int *num,int *bytes)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long local_a0;
  string local_98 [8];
  string num_str;
  string local_68 [8];
  string obj_str;
  char *start;
  char *p;
  int *bytes_local;
  int *num_local;
  int *obj_local;
  string *line_local;
  QPDF *this_local;
  
  start = (char *)std::__cxx11::string::c_str();
  obj_str.field_2._8_8_ = std::__cxx11::string::c_str();
  while (bVar1 = ::qpdf::util::is_space(*start), bVar1) {
    start = start + 1;
  }
  bVar1 = ::qpdf::util::is_digit(*start);
  if (bVar1) {
    std::__cxx11::string::string(local_68);
    while (bVar1 = ::qpdf::util::is_digit(*start), bVar1) {
      start = start + 1;
      std::__cxx11::string::append((ulong)local_68,'\x01');
    }
    bVar1 = ::qpdf::util::is_space(*start);
    if (bVar1) {
      while (bVar1 = ::qpdf::util::is_space(*start), bVar1) {
        start = start + 1;
      }
      bVar1 = ::qpdf::util::is_digit(*start);
      if (bVar1) {
        std::__cxx11::string::string(local_98);
        while (bVar1 = ::qpdf::util::is_digit(*start), bVar1) {
          start = start + 1;
          std::__cxx11::string::append((ulong)local_98,'\x01');
        }
        while (bVar1 = ::qpdf::util::is_space(*start), bVar1) {
          start = start + 1;
        }
        local_a0 = (long)start - obj_str.field_2._8_8_;
        iVar2 = toI<long>(&local_a0);
        *bytes = iVar2;
        pcVar3 = (char *)std::__cxx11::string::c_str();
        iVar2 = QUtil::string_to_int(pcVar3);
        *obj = iVar2;
        pcVar3 = (char *)std::__cxx11::string::c_str();
        iVar2 = QUtil::string_to_int(pcVar3);
        *num = iVar2;
        this_local._7_1_ = true;
        num_str.field_2._8_4_ = 1;
        std::__cxx11::string::~string(local_98);
      }
      else {
        this_local._7_1_ = false;
        num_str.field_2._8_4_ = 1;
      }
    }
    else {
      this_local._7_1_ = false;
      num_str.field_2._8_4_ = 1;
    }
    std::__cxx11::string::~string(local_68);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
QPDF::parse_xrefFirst(std::string const& line, int& obj, int& num, int& bytes)
{
    // is_space and is_digit both return false on '\0', so this will not overrun the null-terminated
    // buffer.
    char const* p = line.c_str();
    char const* start = line.c_str();

    // Skip zero or more spaces
    while (util::is_space(*p)) {
        ++p;
    }
    // Require digit
    if (!util::is_digit(*p)) {
        return false;
    }
    // Gather digits
    std::string obj_str;
    while (util::is_digit(*p)) {
        obj_str.append(1, *p++);
    }
    // Require space
    if (!util::is_space(*p)) {
        return false;
    }
    // Skip spaces
    while (util::is_space(*p)) {
        ++p;
    }
    // Require digit
    if (!util::is_digit(*p)) {
        return false;
    }
    // Gather digits
    std::string num_str;
    while (util::is_digit(*p)) {
        num_str.append(1, *p++);
    }
    // Skip any space including line terminators
    while (util::is_space(*p)) {
        ++p;
    }
    bytes = toI(p - start);
    obj = QUtil::string_to_int(obj_str.c_str());
    num = QUtil::string_to_int(num_str.c_str());
    return true;
}